

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_contact.cpp
# Opt level: O2

void __thiscall
gim_contact_array::merge_contacts_unique(gim_contact_array *this,gim_contact_array *contacts)

{
  long lVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  float fVar4;
  float fVar5;
  btVector3 bVar6;
  GIM_CONTACT_conflict local_50;
  
  gim_array<GIM_CONTACT>::clear((gim_array<GIM_CONTACT> *)this);
  if (*(int *)(contacts + 8) == 1) {
    gim_array<GIM_CONTACT>::push_back
              ((gim_array<GIM_CONTACT> *)this,*(GIM_CONTACT_conflict **)contacts);
    return;
  }
  GIM_CONTACT::GIM_CONTACT
            (&local_50,
             (GIM_CONTACT_conflict *)
             ((ulong)(*(int *)(contacts + 8) - 1) * 0x30 + *(long *)contacts));
  lVar2 = 0x50;
  for (uVar3 = 1; uVar3 < *(uint *)(contacts + 8); uVar3 = uVar3 + 1) {
    lVar1 = *(long *)contacts + lVar2;
    local_50.m_point.m_floats[1] = *(float *)(lVar1 + -0x1c) + local_50.m_point.m_floats[1];
    local_50.m_point.m_floats[0] = *(float *)(lVar1 + -0x20) + local_50.m_point.m_floats[0];
    local_50.m_point.m_floats[2] = *(float *)(lVar1 + -0x18) + local_50.m_point.m_floats[2];
    bVar6 = operator*((btVector3 *)(lVar1 + -0x10),(btScalar *)(*(long *)contacts + lVar2));
    fVar4 = local_50.m_normal.m_floats[1];
    local_50.m_normal.m_floats[0] = local_50.m_normal.m_floats[0] + bVar6.m_floats[0];
    local_50.m_normal.m_floats[1] = fVar4 + bVar6.m_floats[1];
    local_50.m_normal.m_floats[2] = bVar6.m_floats[2] + local_50.m_normal.m_floats[2];
    lVar2 = lVar2 + 0x30;
  }
  fVar4 = 1.0 / (float)*(uint *)(contacts + 8);
  local_50.m_point.m_floats[0] = local_50.m_point.m_floats[0] * fVar4;
  local_50.m_point.m_floats[1] = local_50.m_point.m_floats[1] * fVar4;
  local_50.m_point.m_floats[2] = local_50.m_point.m_floats[2] * fVar4;
  fVar5 = local_50.m_normal.m_floats[1];
  local_50.m_normal.m_floats[0] = local_50.m_normal.m_floats[0] * fVar4;
  local_50.m_normal.m_floats[1] = fVar5 * fVar4;
  local_50.m_normal.m_floats[2] = fVar4 * local_50.m_normal.m_floats[2];
  local_50.m_depth = btVector3::length(&local_50.m_normal);
  btVector3::operator/=(&local_50.m_normal,&local_50.m_depth);
  return;
}

Assistant:

void gim_contact_array::merge_contacts_unique(const gim_contact_array & contacts)
{
	clear();

	if(contacts.size()==1)
	{
		push_back(contacts.back());
		return;
	}

	GIM_CONTACT average_contact = contacts.back();

	for (GUINT i=1;i<contacts.size() ;i++ )
	{
		average_contact.m_point += contacts[i].m_point;
		average_contact.m_normal += contacts[i].m_normal * contacts[i].m_depth;
	}

	//divide
	GREAL divide_average = 1.0f/((GREAL)contacts.size());

	average_contact.m_point *= divide_average;

	average_contact.m_normal *= divide_average;

	average_contact.m_depth = average_contact.m_normal.length();

	average_contact.m_normal /= average_contact.m_depth;

}